

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

bool __thiscall soul::Identifier::operator==(Identifier *this,string_view other)

{
  string *psVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  psVar1 = this->name;
  if (psVar1 != (string *)0x0) {
    __x._M_str = (psVar1->_M_dataplus)._M_p;
    __x._M_len = psVar1->_M_string_length;
    bVar2 = std::operator==(__x,other);
    return bVar2;
  }
  throwInternalCompilerError("isValid()","operator==",0x28);
}

Assistant:

bool isValid() const noexcept                                   { return name != nullptr; }